

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::MapBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,MAP_TYPE MapType,MAP_FLAGS MapFlags,
          PVoid *pMappedData)

{
  vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
  *this_00;
  USAGE UVar1;
  uint uVar2;
  Int32 IVar3;
  BufferVkImpl *this_01;
  Uint8 *pUVar4;
  undefined7 in_register_00000011;
  char (*Args_2) [115];
  IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *in_R9;
  int iVar5;
  BufferDesc *Args;
  pointer pMVar6;
  ulong uVar7;
  Uint8 local_61;
  string msg;
  
  Args_2 = (char (*) [115])pMappedData;
  DeviceContextBase<Diligent::EngineVkImplTraits>::MapBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,MapType,MapFlags,
             pMappedData);
  this_01 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  iVar5 = (int)CONCAT71(in_register_00000011,MapType);
  if (iVar5 == 3) {
    LogError<false,char[50]>
              (false,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8b8,(char (*) [50])"MAP_READ_WRITE is not supported in Vulkan backend");
    return;
  }
  if (iVar5 == 2) {
    UVar1 = (this_01->super_BufferBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            .m_Desc.Usage;
    if (1 < UVar1 - 3) {
      if (UVar1 != USAGE_DYNAMIC) {
        LogError<false,char[93]>
                  (false,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8b3,(char (*) [93])
                          "Only USAGE_DYNAMIC, USAGE_STAGING and USAGE_UNIFIED Vulkan buffers can be mapped for writing"
                  );
        return;
      }
      Args = &(this_01->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc;
      if ((MapFlags & (MAP_FLAG_NO_OVERWRITE|MAP_FLAG_DISCARD)) == MAP_FLAG_NONE) {
        local_61 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                   super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.ContextId;
        Args_2 = (char (*) [115])&local_61;
        FormatString<char[23],char_const*,char[110],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>>
                  (&msg,(Diligent *)"Failed to map buffer \'",(char (*) [23])Args,
                   (char **)
                   "\': Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag. Context Id: "
                   ,(char (*) [110])Args_2,in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x889);
        std::__cxx11::string::~string((string *)&msg);
      }
      uVar2 = (this_01->super_BufferBase<Diligent::EngineVkImplTraits>).m_DynamicBufferId;
      uVar7 = (ulong)uVar2;
      if (uVar7 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                   (char **)"\' does not have dynamic buffer ID",(char (*) [34])Args_2);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x88c);
        std::__cxx11::string::~string((string *)&msg);
      }
      this_00 = &this->m_MappedBuffers;
      pMVar6 = (this->m_MappedBuffers).
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->m_MappedBuffers).
                         super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x28) <= uVar7
         ) {
        std::
        vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
        ::resize(this_00,(ulong)(uVar2 + 1));
        pMVar6 = (this_00->
                 super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      pMVar6 = pMVar6 + uVar7;
      IVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)this_01);
      (this_00->
      super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar7].DvpBufferUID = IVar3;
      if (((MapFlags & MAP_FLAG_DISCARD) == MAP_FLAG_NONE) &&
         ((pMVar6->Allocation).pDynamicMemMgr != (VulkanDynamicMemoryManager *)0x0)) {
        if ((MapFlags & MAP_FLAG_NO_OVERWRITE) == MAP_FLAG_NONE) {
          FormatString<char[9],char_const*,char[115]>
                    (&msg,(Diligent *)0x6f3938,(char (*) [9])Args,
                     (char **)
                     "\' is already mapped. Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag."
                     ,Args_2);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"MapBuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x899);
          std::__cxx11::string::~string((string *)&msg);
        }
        if ((this_01->m_VulkanBuffer).m_VkObject != (VkBuffer_T *)0x0) {
          LogError<false,char[398]>
                    (false,"MapBuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x8a0,(char (*) [398])
                            "Formatted or structured buffers require actual Vulkan backing resource and cannot be suballocated from dynamic heap. In current implementation, the entire contents of the backing buffer is updated when the buffer is unmapped. As a consequence, the buffer cannot be mapped with MAP_FLAG_NO_OVERWRITE flag because updating the whole buffer will overwrite regions that may still be in use by the GPU."
                    );
          return;
        }
        msg._M_dataplus._M_p = (pointer)(pMVar6->Allocation).pDynamicMemMgr;
      }
      else {
        AllocateDynamicSpace
                  ((VulkanDynamicAllocation *)&msg,this,
                   (this_01->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.Size,this_01->m_DynamicOffsetAlignment);
        (pMVar6->Allocation).pDynamicMemMgr = (VulkanDynamicMemoryManager *)msg._M_dataplus._M_p;
        (pMVar6->Allocation).AlignedOffset = msg._M_string_length;
        (pMVar6->Allocation).Size = msg.field_2._M_allocated_capacity;
        (pMVar6->Allocation).dvpFrameNumber = msg.field_2._8_8_;
      }
      if ((VulkanDynamicMemoryManager *)msg._M_dataplus._M_p == (VulkanDynamicMemoryManager *)0x0) {
        pUVar4 = (Uint8 *)0x0;
      }
      else {
        pUVar4 = ((VulkanDynamicMemoryManager *)msg._M_dataplus._M_p)->m_CPUAddress +
                 (pMVar6->Allocation).AlignedOffset;
      }
      goto LAB_002787f3;
    }
  }
  else {
    if (iVar5 != 1) {
      FormatString<char[17]>(&msg,(char (*) [17])"Unknown map type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8bc);
      std::__cxx11::string::~string((string *)&msg);
      return;
    }
    if (1 < (byte)((this_01->super_BufferBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                   .m_Desc.Usage - USAGE_STAGING)) {
      FormatString<char[82]>
                (&msg,(char (*) [82])
                      "Buffer must be created as USAGE_STAGING or USAGE_UNIFIED to be mapped for reading"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x875);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == MAP_FLAG_NONE) {
      FormatString<char[207]>
                (&msg,(char (*) [207])
                      "Vulkan backend never waits for GPU when mapping staging buffers for reading. Applications must use fences or other synchronization methods to explicitly synchronize access and use MAP_FLAG_DO_NOT_WAIT flag."
                );
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  pUVar4 = (Uint8 *)BufferVkImpl::GetCPUAddress(this_01);
LAB_002787f3:
  *pMappedData = pUVar4;
  return;
}

Assistant:

void DeviceContextVkImpl::MapBuffer(IBuffer* pBuffer, MAP_TYPE MapType, MAP_FLAGS MapFlags, PVoid& pMappedData)
{
    TDeviceContextBase::MapBuffer(pBuffer, MapType, MapFlags, pMappedData);
    BufferVkImpl* const pBufferVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    const BufferDesc&   BuffDesc  = pBufferVk->GetDesc();

    if (MapType == MAP_READ)
    {
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                      "Buffer must be created as USAGE_STAGING or USAGE_UNIFIED to be mapped for reading");

        if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == 0)
        {
            LOG_WARNING_MESSAGE("Vulkan backend never waits for GPU when mapping staging buffers for reading. "
                                "Applications must use fences or other synchronization methods to explicitly synchronize "
                                "access and use MAP_FLAG_DO_NOT_WAIT flag.");
        }

        pMappedData = pBufferVk->GetCPUAddress();
    }
    else if (MapType == MAP_WRITE)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            pMappedData = pBufferVk->GetCPUAddress();
        }
        else if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0, "Failed to map buffer '",
                          BuffDesc.Name, "': Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag. Context Id: ", GetContextId());

            const Uint32 DynamicBufferId = pBufferVk->GetDynamicBufferId();
            VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", BuffDesc.Name, "' does not have dynamic buffer ID");
            if (m_MappedBuffers.size() <= DynamicBufferId)
                m_MappedBuffers.resize(DynamicBufferId + 1);
            VulkanDynamicAllocation& DynAllocation = m_MappedBuffers[DynamicBufferId].Allocation;
#ifdef DILIGENT_DEVELOPMENT
            m_MappedBuffers[DynamicBufferId].DvpBufferUID = pBufferVk->GetUniqueID();
#endif
            if ((MapFlags & MAP_FLAG_DISCARD) != 0 || !DynAllocation)
            {
                DynAllocation = AllocateDynamicSpace(BuffDesc.Size, pBufferVk->m_DynamicOffsetAlignment);
            }
            else
            {
                DEV_CHECK_ERR(MapFlags & MAP_FLAG_NO_OVERWRITE, "Buffer '", BuffDesc.Name, "' is already mapped. Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag.");

                if (pBufferVk->m_VulkanBuffer != VK_NULL_HANDLE)
                {
                    LOG_ERROR("Formatted or structured buffers require actual Vulkan backing resource and cannot be suballocated "
                              "from dynamic heap. In current implementation, the entire contents of the backing buffer is updated when the buffer is unmapped. "
                              "As a consequence, the buffer cannot be mapped with MAP_FLAG_NO_OVERWRITE flag because updating the whole "
                              "buffer will overwrite regions that may still be in use by the GPU.");
                    return;
                }

                // Reuse the same allocation
            }

            if (DynAllocation)
            {
                Uint8* CPUAddress = DynAllocation.pDynamicMemMgr->GetCPUAddress();
                pMappedData       = CPUAddress + DynAllocation.AlignedOffset;
            }
            else
            {
                pMappedData = nullptr;
            }
        }
        else
        {
            LOG_ERROR("Only USAGE_DYNAMIC, USAGE_STAGING and USAGE_UNIFIED Vulkan buffers can be mapped for writing");
        }
    }
    else if (MapType == MAP_READ_WRITE)
    {
        LOG_ERROR("MAP_READ_WRITE is not supported in Vulkan backend");
    }
    else
    {
        UNEXPECTED("Unknown map type");
    }
}